

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  bool bVar1;
  HandlerResponse HVar2;
  ostream *poVar3;
  ulong uVar4;
  ssize_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ssize_t sVar8;
  Headers *headers;
  undefined1 auVar9 [16];
  bool local_2f1;
  bool local_2e1;
  bool ret;
  string *data;
  size_type sStack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2c8;
  _Base_ptr local_2b8;
  size_t sStack_2b0;
  undefined4 local_29c;
  undefined1 local_298 [8];
  undefined1 local_290 [8];
  BufferStream bstrm;
  stringstream local_240 [8];
  stringstream ss;
  ostream local_230 [383];
  byte local_b1;
  string local_b0;
  undefined1 local_80 [8];
  string boundary;
  string content_type;
  bool need_apply_ranges_local;
  Response *res_local;
  Request *req_local;
  bool close_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                  ,0x114e,
                  "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
                 );
  }
  content_type.field_2._M_local_buf[0xf] = need_apply_ranges;
  if (((399 < res->status) &&
      (bVar1 = std::function::operator_cast_to_bool((function *)&this->error_handler_), bVar1)) &&
     (HVar2 = std::
              function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
              ::operator()(&this->error_handler_,req,res), HVar2 == Handled)) {
    content_type.field_2._M_local_buf[0xf] = '\x01';
  }
  std::__cxx11::string::string((string *)(boundary.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  if ((content_type.field_2._M_local_buf[0xf] & 1U) != 0) {
    apply_ranges(this,req,res,(string *)((long)&boundary.field_2 + 8),(string *)local_80);
  }
  local_b1 = 0;
  local_2f1 = true;
  if (!close_connection) {
    Request::get_header_value_abi_cxx11_(&local_b0,req,"Connection",0);
    local_b1 = 1;
    local_2f1 = std::operator==(&local_b0,"close");
  }
  if ((local_b1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (local_2f1 == false) {
    std::__cxx11::stringstream::stringstream(local_240);
    poVar3 = std::operator<<(local_230,"timeout=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->keep_alive_timeout_sec_);
    poVar3 = std::operator<<(poVar3,", max=");
    std::ostream::operator<<(poVar3,this->keep_alive_max_count_);
    std::__cxx11::stringstream::str();
    Response::set_header(res,"Keep-Alive",(string *)&bstrm.position);
    std::__cxx11::string::~string((string *)&bstrm.position);
    std::__cxx11::stringstream::~stringstream(local_240);
  }
  else {
    Response::set_header(res,"Connection","close");
  }
  bVar1 = Response::has_header(res,"Content-Type");
  if ((!bVar1) &&
     (((uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0 || (res->content_length_ != 0)) ||
      (bVar1 = std::function::operator_cast_to_bool((function *)&res->content_provider_), bVar1))))
  {
    Response::set_header(res,"Content-Type","text/plain");
  }
  bVar1 = Response::has_header(res,"Content-Length");
  if (((!bVar1) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) &&
     ((res->content_length_ == 0 &&
      (bVar1 = std::function::operator_cast_to_bool((function *)&res->content_provider_), !bVar1))))
  {
    Response::set_header(res,"Content-Length","0");
  }
  bVar1 = Response::has_header(res,"Accept-Ranges");
  if ((!bVar1) && (bVar1 = std::operator==(&req->method,"HEAD"), bVar1)) {
    Response::set_header(res,"Accept-Ranges","bytes");
  }
  bVar1 = std::function::operator_cast_to_bool((function *)&this->post_routing_handler_);
  if (bVar1) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->post_routing_handler_,req,res);
  }
  detail::BufferStream::BufferStream((BufferStream *)local_290);
  local_298 = (undefined1  [8])detail::status_message(res->status);
  headers = (Headers *)local_298;
  sVar5 = Stream::write_format<int,char_const*>
                    ((Stream *)local_290,"HTTP/1.1 %d %s\r\n",&res->status,(char **)headers);
  if (sVar5 == 0) {
    this_local._7_1_ = 0;
    local_29c = 1;
  }
  else {
    local_2b8 = (_Base_ptr)0x0;
    sStack_2b0 = 0;
    local_2c8._M_allocated_capacity = 0;
    local_2c8._8_8_ = 0;
    data = (string *)0x0;
    sStack_2d0 = 0;
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&data);
    sVar5 = detail::write_headers<httplib::Response>
                      ((detail *)local_290,(Stream *)res,(Response *)&data,headers);
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&data);
    if (sVar5 == 0) {
      this_local._7_1_ = 0;
      local_29c = 1;
    }
    else {
      detail::BufferStream::get_buffer_abi_cxx11_((BufferStream *)local_290);
      uVar6 = std::__cxx11::string::data();
      uVar7 = std::__cxx11::string::size();
      (*strm->_vptr_Stream[5])(strm,uVar6,uVar7);
      local_29c = 0;
    }
  }
  detail::BufferStream::~BufferStream((BufferStream *)local_290);
  if (local_29c == 0) {
    local_2e1 = true;
    bVar1 = std::operator!=(&req->method,"HEAD");
    if (bVar1) {
      auVar9 = std::__cxx11::string::empty();
      if ((auVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        sVar8 = Stream::write(strm,(int)res + 0x78,auVar9._8_8_,(size_t)headers);
        local_2e1 = sVar8 != 0;
      }
      else {
        bVar1 = std::function::operator_cast_to_bool((function *)&res->content_provider_);
        if (bVar1) {
          local_2e1 = write_content_with_provider
                                (this,strm,req,res,(string *)local_80,
                                 (string *)((long)&boundary.field_2 + 8));
        }
      }
    }
    bVar1 = std::function::operator_cast_to_bool((function *)&this->logger_);
    if (bVar1) {
      std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                (&this->logger_,req,res);
    }
    this_local._7_1_ = local_2e1;
    local_29c = 1;
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(boundary.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
											const Request &req, Response &res,
											bool need_apply_ranges) {
		assert(res.status != -1);

		if (400 <= res.status && error_handler_ &&
			error_handler_(req, res) == HandlerResponse::Handled) {
			need_apply_ranges = true;
		}

		std::string content_type;
		std::string boundary;
		if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

		// Prepare additional headers
		if (close_connection || req.get_header_value("Connection") == "close") {
			res.set_header("Connection", "close");
		} else {
			std::stringstream ss;
			ss << "timeout=" << keep_alive_timeout_sec_
			   << ", max=" << keep_alive_max_count_;
			res.set_header("Keep-Alive", ss.str());
		}

		if (!res.has_header("Content-Type") &&
			(!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
			res.set_header("Content-Type", "text/plain");
		}

		if (!res.has_header("Content-Length") && res.body.empty() &&
			!res.content_length_ && !res.content_provider_) {
			res.set_header("Content-Length", "0");
		}

		if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
			res.set_header("Accept-Ranges", "bytes");
		}

		if (post_routing_handler_) { post_routing_handler_(req, res); }

		// Response line and headers
		{
			detail::BufferStream bstrm;

			if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
									detail::status_message(res.status))) {
				return false;
			}

			if (!detail::write_headers(bstrm, res, Headers())) { return false; }

			// Flush buffer
			auto &data = bstrm.get_buffer();
			strm.write(data.data(), data.size());
		}

		// Body
		auto ret = true;
		if (req.method != "HEAD") {
			if (!res.body.empty()) {
				if (!strm.write(res.body)) { ret = false; }
			} else if (res.content_provider_) {
				if (!write_content_with_provider(strm, req, res, boundary,
												 content_type)) {
					ret = false;
				}
			}
		}

		// Log
		if (logger_) { logger_(req, res); }

		return ret;
	}